

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDecoder.cpp
# Opt level: O3

int ZXing::Pdf417::TextCompaction
              (vector<int,_std::allocator<int>_> *codewords,int codeIndex,Content *result)

{
  int *piVar1;
  uint8_t val;
  long *plVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  vector<int,_std::allocator<int>_> textCompactionData;
  allocator_type local_71;
  vector<int,_std::allocator<int>_> local_70;
  value_type_conflict3 local_54;
  uint *local_50;
  undefined8 local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_54 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_70,
             ((long)*(codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start - (long)codeIndex) * 2,&local_54,&local_71);
  piVar1 = (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (codeIndex < *piVar1) {
    iVar4 = 0;
    do {
      iVar9 = codeIndex + 1;
      iVar3 = piVar1[codeIndex];
      iVar10 = iVar9;
      if (iVar3 < 900) {
        *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                         local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                        _M_start + (long)iVar4 * 4) = iVar3 / 0x1e;
        *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                         local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                        _M_start + (long)iVar4 * 4 + 4) = iVar3 % 0x1e;
        iVar7 = iVar4 + 2;
      }
      else if (iVar3 - 0x39dU < 3) {
        *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                         local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                        _M_start + (long)iVar4 * 4) = iVar3;
        iVar7 = iVar4 + 1;
        if (iVar9 < *piVar1) {
          iVar10 = codeIndex + 2;
          iVar7 = iVar4 + 2;
          *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                           local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                          _M_start + (long)(iVar4 + 1) * 4) = piVar1[iVar9];
          if ((iVar3 == 0x39e) && (iVar10 < *piVar1)) {
            *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                             local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                            _M_start + (long)iVar7 * 4) = piVar1[iVar10];
            iVar10 = codeIndex + 3;
            iVar7 = iVar4 + 3;
          }
        }
      }
      else {
        uVar5 = iVar3 - 900;
        if (0x1c < uVar5) {
LAB_001704ae:
          plVar2 = (long *)__cxa_allocate_exception(0x30);
          local_50 = &local_40;
          uVar5 = local_40 >> 8;
          local_40 = uVar5 << 8;
          *plVar2 = (long)(plVar2 + 2);
          *(uint *)(plVar2 + 2) = local_40;
          *(undefined4 *)((long)plVar2 + 0x14) = uStack_3c;
          *(undefined4 *)(plVar2 + 3) = uStack_38;
          *(undefined4 *)((long)plVar2 + 0x1c) = uStack_34;
          plVar2[1] = 0;
          local_48 = 0;
          local_40 = uVar5 << 8;
          plVar2[4] = (long)"src/pdf417/PDFDecoder.cpp";
          *(undefined2 *)(plVar2 + 5) = 0x125;
          *(undefined1 *)((long)plVar2 + 0x2a) = 1;
          __cxa_throw(plVar2,&Error::typeinfo,Error::~Error);
        }
        if (uVar5 != 0xd) {
          if ((0x11c00007U >> (uVar5 & 0x1f) & 1) == 0) goto LAB_001704ae;
          break;
        }
        iVar3 = iVar4 + 1;
        *(undefined4 *)
         ((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data._M_start +
         (long)iVar4 * 4) = 0x391;
        iVar7 = iVar3;
        if (iVar9 < *piVar1) {
          do {
            iVar4 = piVar1[iVar9];
            iVar10 = iVar9 + 1;
            *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                             local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                            _M_start + (long)iVar3 * 4) = iVar4;
            iVar7 = iVar3 + 1;
            if (2 < iVar4 - 0x39dU) break;
            iVar6 = *piVar1;
            if (iVar10 < iVar6) {
              iVar8 = iVar9 + 2;
              *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                               local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                              _M_start + (long)iVar7 * 4) = piVar1[iVar10];
              iVar6 = *piVar1;
              iVar10 = iVar8;
              iVar7 = iVar3 + 2;
              if (iVar4 == 0x39e && iVar8 < iVar6) {
                *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                                 local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data
                                ._M_start + (long)(iVar3 + 2) * 4) = piVar1[iVar8];
                iVar6 = *piVar1;
                iVar10 = iVar9 + 3;
                iVar7 = iVar3 + 3;
              }
            }
            iVar3 = iVar7;
            iVar9 = iVar10;
            iVar10 = iVar9;
            iVar7 = iVar3;
          } while (iVar9 < iVar6);
        }
      }
      iVar4 = iVar7;
      codeIndex = iVar10;
    } while (codeIndex < *piVar1);
    if (0 < iVar4) {
      iVar10 = 0;
      iVar9 = 0;
      do {
        iVar3 = *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                                 local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data
                                ._M_start + (long)iVar9 * 4);
        if (iVar3 - 0x39dU < 3) {
          iVar9 = ProcessECI((vector<int,_std::allocator<int>_> *)
                             local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,iVar9 + 1,iVar4,iVar3,result);
        }
        else if (iVar3 == 0x391) {
          for (iVar9 = iVar9 + 1; iVar9 < iVar4;
              iVar9 = ProcessECI((vector<int,_std::allocator<int>_> *)
                                 local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start,iVar9,iVar4,iVar3,result)) {
            iVar3 = *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                                     local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start)->_M_impl).
                                    super__Vector_impl_data._M_start + (long)iVar9 * 4);
            iVar9 = iVar9 + 1;
            if (2 < iVar3 - 0x39dU) {
              Content::push_back(result,(uint8_t)iVar3);
              break;
            }
          }
        }
        else {
          if (iVar3 < 0x1a) {
            val = (iVar10 != 0) * ' ' + (char)iVar3 + 'A';
            if (val != '\0') {
LAB_001703ba:
              Content::push_back(result,val);
            }
          }
          else {
            val = ' ';
            if (iVar3 == 0x1a) goto LAB_001703ba;
            if ((iVar3 == 0x1b) && (iVar10 == 0)) {
              iVar10 = 1;
            }
            else if ((iVar3 == 0x1b) && (iVar10 == 1)) {
              iVar10 = 4;
            }
            else if (iVar3 == 0x1c) {
              iVar10 = 2;
            }
            else if ((iVar9 + 1 < iVar4) &&
                    (*(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                                      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start)->_M_impl).
                                     super__Vector_impl_data._M_start + (long)(iVar9 + 1) * 4) !=
                     0x391)) {
              iVar10 = 5;
            }
          }
          iVar9 = iVar9 + 1;
        }
      } while (iVar9 < iVar4);
    }
  }
  if ((vector<int,_std::allocator<int>_> *)
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (vector<int,_std::allocator<int>_> *)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return codeIndex;
}

Assistant:

static int TextCompaction(const std::vector<int>& codewords, int codeIndex, Content& result)
{
	// 2 characters per codeword
	std::vector<int> textCompactionData((codewords[0] - codeIndex) * 2, 0);

	int index = 0;
	bool end = false;

	while ((codeIndex < codewords[0]) && !end) {
		int code = codewords[codeIndex++];
		if (code < TEXT_COMPACTION_MODE_LATCH) {
			textCompactionData[index] = code / 30;
			textCompactionData[index + 1] = code % 30;
			index += 2;
		} else {
			switch (code) {
			case MODE_SHIFT_TO_BYTE_COMPACTION_MODE:
				// The Mode Shift codeword 913 shall cause a temporary
				// switch from Text Compaction mode to Byte Compaction mode.
				// This switch shall be in effect for only the next codeword,
				// after which the mode shall revert to the prevailing sub-mode
				// of the Text Compaction mode. Codeword 913 is only available
				// in Text Compaction mode; its use is described in 5.4.2.4.
				textCompactionData[index++] = MODE_SHIFT_TO_BYTE_COMPACTION_MODE;
				// 5.5.3.1 allows ECIs anywhere in Text Compaction, including after a Shift to Byte
				while (codeIndex < codewords[0] && IsECI(codewords[codeIndex])) {
					codeIndex = ProcessTextECI(textCompactionData, index, codewords, codeIndex + 1, codewords[codeIndex]);
				}
				if (codeIndex < codewords[0])
					textCompactionData[index++] = codewords[codeIndex++]; // Byte to shift
				break;
			case ECI_CHARSET:
			case ECI_GENERAL_PURPOSE:
			case ECI_USER_DEFINED:
				codeIndex = ProcessTextECI(textCompactionData, index, codewords, codeIndex, code);
				break;
			default:
				if (!TerminatesCompaction(code))
					throw FormatError();

				codeIndex--;
				end = true;
				break;
			}
		}
	}
	DecodeTextCompaction(textCompactionData, index, result);
	return codeIndex;
}